

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaItemListRemove(xmlSchemaItemListPtr list,int idx)

{
  int local_20;
  int i;
  int idx_local;
  xmlSchemaItemListPtr list_local;
  
  if ((list->items == (void **)0x0) || (list->nbItems <= idx)) {
    list_local._4_4_ = -1;
  }
  else {
    if (list->nbItems == 1) {
      (*xmlFree)(list->items);
      list->items = (void **)0x0;
      list->nbItems = 0;
      list->sizeItems = 0;
    }
    else {
      local_20 = idx;
      if (list->nbItems + -1 == idx) {
        list->nbItems = list->nbItems + -1;
      }
      else {
        for (; local_20 < list->nbItems + -1; local_20 = local_20 + 1) {
          list->items[local_20] = list->items[local_20 + 1];
        }
        list->nbItems = list->nbItems + -1;
      }
    }
    list_local._4_4_ = 0;
  }
  return list_local._4_4_;
}

Assistant:

static int
xmlSchemaItemListRemove(xmlSchemaItemListPtr list, int idx)
{
    int i;
    if ((list->items == NULL) || (idx >= list->nbItems))
	return(-1);

    if (list->nbItems == 1) {
	/* TODO: Really free the list? */
	xmlFree(list->items);
	list->items = NULL;
	list->nbItems = 0;
	list->sizeItems = 0;
    } else if (list->nbItems -1 == idx) {
	list->nbItems--;
    } else {
	for (i = idx; i < list->nbItems -1; i++)
	    list->items[i] = list->items[i+1];
	list->nbItems--;
    }
    return(0);
}